

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriesestimator.cxx
# Opt level: O3

Matrix * __thiscall
SeriesEstimator::getDistribution(Matrix *__return_storage_ptr__,SeriesEstimator *this)

{
  pointer pcVar1;
  size_type *psVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  StochasticEventGenerator *pSVar6;
  pointer pcVar7;
  double dVar8;
  uint uVar9;
  long *plVar10;
  undefined8 *puVar11;
  long *plVar12;
  ulong *puVar13;
  size_type *psVar14;
  int i;
  ulong uVar15;
  _func_int *p_Var16;
  int iVar17;
  long lVar18;
  _func_int **local_3c8;
  long local_3c0;
  _func_int *local_3b8 [2];
  ulong local_3a8;
  long local_3a0;
  double local_398;
  double local_390;
  ulong local_388;
  long *local_380;
  long local_378;
  long local_370;
  long lStack_368;
  long *local_360 [2];
  long local_350 [2];
  longdouble local_33c;
  undefined1 local_330 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_318 [14];
  Matrix local_230;
  Matrix local_130;
  
  uVar9 = (this->super_Estimator).nSamples;
  local_388 = (ulong)uVar9;
  local_33c = (longdouble)local_388;
  if (uVar9 == 0) {
    local_33c = (longdouble)1;
  }
  uVar9 = this->estimatorPost + this->estimatorPre;
  Matrix::Matrix(__return_storage_ptr__,uVar9,this->estimatorDistLength,3);
  pcVar1 = local_330 + 0x10;
  local_330._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"conditional density","");
  Matrix::setName(__return_storage_ptr__,(string *)local_330);
  if ((pointer)local_330._0_8_ != pcVar1) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  pSVar6 = this->seriesSource;
  if (pSVar6 == (StochasticEventGenerator *)0x0) goto LAB_00145979;
  pcVar7 = (pSVar6->super_StochasticVariable).super_StochasticProcess.super_Parametric.
           parametricName._M_dataplus._M_p;
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_360,pcVar7,
             pcVar7 + (pSVar6->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                      parametricName._M_string_length);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_360,0,(char *)0x0,0x14c119);
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_370 = *plVar12;
    lStack_368 = plVar10[3];
    local_380 = &local_370;
  }
  else {
    local_370 = *plVar12;
    local_380 = (long *)*plVar10;
  }
  local_378 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_380);
  psVar2 = &local_130.super_Physical.physicalDescription._M_string_length;
  puVar13 = (ulong *)(plVar10 + 2);
  if ((size_type *)*plVar10 == puVar13) {
    local_130.super_Physical.physicalDescription._M_string_length = *puVar13;
    local_130.super_Physical.physicalDescription.field_2._M_allocated_capacity._0_4_ =
         (undefined4)plVar10[3];
    local_130.super_Physical.physicalDescription.field_2._M_allocated_capacity._4_4_ =
         *(undefined4 *)((long)plVar10 + 0x1c);
    local_130.super_Physical._vptr_Physical = (_func_int **)psVar2;
  }
  else {
    local_130.super_Physical.physicalDescription._M_string_length = *puVar13;
    local_130.super_Physical._vptr_Physical = (_func_int **)*plVar10;
  }
  local_130.super_Physical.physicalDescription._M_dataplus._M_p = (pointer)plVar10[1];
  *plVar10 = (long)puVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  pcVar7 = (this->seriesSource->super_StochasticVariable).super_StochasticProcess.super_Parametric.
           parametricType._M_dataplus._M_p;
  local_3c8 = local_3b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,pcVar7,
             pcVar7 + (this->seriesSource->super_StochasticVariable).super_StochasticProcess.
                      super_Parametric.parametricType._M_string_length);
  p_Var16 = (_func_int *)0xf;
  if (local_130.super_Physical._vptr_Physical != (_func_int **)psVar2) {
    p_Var16 = (_func_int *)local_130.super_Physical.physicalDescription._M_string_length;
  }
  if (p_Var16 < local_130.super_Physical.physicalDescription._M_dataplus._M_p + local_3c0) {
    p_Var16 = (_func_int *)0xf;
    if (local_3c8 != local_3b8) {
      p_Var16 = local_3b8[0];
    }
    if (p_Var16 < local_130.super_Physical.physicalDescription._M_dataplus._M_p + local_3c0)
    goto LAB_001457ee;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3c8,0,(char *)0x0,
                         (ulong)local_130.super_Physical._vptr_Physical);
  }
  else {
LAB_001457ee:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_3c8);
  }
  local_230.super_Physical._vptr_Physical =
       (_func_int **)&local_230.super_Physical.physicalDescription._M_string_length;
  psVar14 = puVar11 + 2;
  if ((size_type *)*puVar11 == psVar14) {
    local_230.super_Physical.physicalDescription._M_string_length = *psVar14;
    local_230.super_Physical.physicalDescription.field_2._M_allocated_capacity = puVar11[3];
  }
  else {
    local_230.super_Physical.physicalDescription._M_string_length = *psVar14;
    local_230.super_Physical._vptr_Physical = (_func_int **)*puVar11;
  }
  local_230.super_Physical.physicalDescription._M_dataplus._M_p = (pointer)puVar11[1];
  *puVar11 = psVar14;
  puVar11[1] = 0;
  *(undefined1 *)psVar14 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_230);
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_330._16_8_ = *psVar14;
    aaStack_318[0]._0_8_ = plVar10[3];
    local_330._0_8_ = pcVar1;
  }
  else {
    local_330._16_8_ = *psVar14;
    local_330._0_8_ = (size_type *)*plVar10;
  }
  local_330._8_8_ = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  Matrix::setName(__return_storage_ptr__,(string *)local_330);
  if ((pointer)local_330._0_8_ != pcVar1) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  if (local_230.super_Physical._vptr_Physical !=
      (_func_int **)&local_230.super_Physical.physicalDescription._M_string_length) {
    operator_delete(local_230.super_Physical._vptr_Physical,
                    local_230.super_Physical.physicalDescription._M_string_length + 1);
  }
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8,(ulong)(local_3b8[0] + 1));
  }
  if (local_130.super_Physical._vptr_Physical != (_func_int **)psVar2) {
    operator_delete(local_130.super_Physical._vptr_Physical,
                    (ulong)(local_130.super_Physical.physicalDescription._M_string_length + 1));
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,local_370 + 1);
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
LAB_00145979:
  iVar17 = this->estimatorDistLength;
  if ((0 < iVar17 & (byte)(this->super_Estimator).nEstimate >> 1) == 1) {
    local_3a8 = (ulong)uVar9;
    lVar18 = 0;
    do {
      if (0 < (int)uVar9) {
        iVar17 = (int)lVar18;
        local_398 = (double)iVar17;
        local_3a0 = lVar18 << 4;
        uVar15 = 0;
        do {
          i = (int)uVar15;
          iVar5 = this->estimatorPre;
          Matrix::operator[](&local_130,__return_storage_ptr__,i);
          Matrix::operator[](&local_230,&local_130,iVar17);
          Matrix::operator[]((Matrix *)local_330,&local_230,0);
          Matrix::operator=((Matrix *)local_330,(double)(i - iVar5));
          Matrix::~Matrix((Matrix *)local_330);
          Matrix::~Matrix(&local_230);
          Matrix::~Matrix(&local_130);
          dVar8 = this->estimatorDistScale * local_398;
          dVar3 = this->estimatorDistOffset;
          dVar4 = ((this->super_Estimator).estimatorTime)->dt;
          Matrix::operator[](&local_130,__return_storage_ptr__,i);
          Matrix::operator[](&local_230,&local_130,iVar17);
          Matrix::operator[]((Matrix *)local_330,&local_230,1);
          Matrix::operator=((Matrix *)local_330,(dVar8 + dVar3) * dVar4);
          Matrix::~Matrix((Matrix *)local_330);
          Matrix::~Matrix(&local_230);
          Matrix::~Matrix(&local_130);
          dVar3 = (double)(*(longdouble *)((long)this->estimatorDist[uVar15] + local_3a0) /
                          local_33c);
          local_390 = dVar3;
          Matrix::operator[](&local_130,__return_storage_ptr__,i);
          Matrix::operator[](&local_230,&local_130,iVar17);
          Matrix::operator[]((Matrix *)local_330,&local_230,2);
          Matrix::operator=((Matrix *)local_330,dVar3);
          Matrix::~Matrix((Matrix *)local_330);
          Matrix::~Matrix(&local_230);
          Matrix::~Matrix(&local_130);
          uVar15 = uVar15 + 1;
        } while (local_3a8 != uVar15);
        iVar17 = this->estimatorDistLength;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar17);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix SeriesEstimator::getDistribution()
{
	double samples = (nSamples!=0.0)? double(nSamples): 1.0;
	
	int timeSize = estimatorPre+estimatorPost;
	Matrix a(timeSize, estimatorDistLength, 3);
	a.setName("conditional density");
	if (seriesSource)
		a.setName("density of " + seriesSource->getName() + " (" + seriesSource->getType() + ")" );
	
	if ( nEstimate & EST_DENS ) {
		for ( int j=0; j<estimatorDistLength; j++)
			for ( int i=0; i<timeSize; i++ ) {
				a[i][j][0] = i - estimatorPre;
				a[i][j][1] = estimatorTime->dt * ((double(j) * estimatorDistScale) + estimatorDistOffset);
				a[i][j][2] = estimatorDist[i][j] / samples;
			}
	}
	return a;
}